

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

int xmlParseElementDecl(xmlParserCtxtPtr ctxt)

{
  byte bVar1;
  xmlChar xVar2;
  xmlType xVar3;
  int iVar4;
  xmlParserInputPtr pxVar5;
  byte *pbVar6;
  elementDeclSAXFunc p_Var7;
  int iVar8;
  xmlChar *pxVar9;
  char *msg;
  xmlParserErrors error;
  xmlElementContentPtr cur;
  xmlDocPtr doc;
  xmlElementContentPtr content;
  xmlElementContentPtr local_28;
  
  local_28 = (xmlElementContentPtr)0x0;
  xVar3 = ctxt->mlType;
  if ((((((xVar3 != XML_TYPE_XML) || (pxVar9 = ctxt->input->cur, *pxVar9 != '<')) ||
        (pxVar9[1] != '!')) ||
       (((pxVar9[2] != 'E' || (pxVar9[3] != 'L')) ||
        ((pxVar9[4] != 'E' || ((pxVar9[5] != 'M' || (pxVar9[6] != 'E')))))))) || (pxVar9[7] != 'N'))
     || (pxVar9[8] != 'T')) {
    if (xVar3 != XML_TYPE_SML) {
      return -1;
    }
    pxVar9 = ctxt->input->cur;
    if (*pxVar9 != '!') {
      return -1;
    }
    if (pxVar9[1] != 'E') {
      return -1;
    }
    if (pxVar9[2] != 'L') {
      return -1;
    }
    if (pxVar9[3] != 'E') {
      return -1;
    }
    if (pxVar9[4] != 'M') {
      return -1;
    }
    if (pxVar9[5] != 'E') {
      return -1;
    }
    if (pxVar9[6] != 'N') {
      return -1;
    }
    if (pxVar9[7] != 'T') {
      return -1;
    }
  }
  pxVar5 = ctxt->input;
  iVar4 = pxVar5->id;
  pxVar9 = pxVar5->cur;
  pxVar5->cur = pxVar9 + (ulong)(xVar3 == XML_TYPE_XML) + 8;
  pxVar5->col = (uint)(xVar3 == XML_TYPE_XML) + pxVar5->col + 8;
  if (pxVar9[(ulong)(xVar3 == XML_TYPE_XML) + 8] == '\0') {
    xmlParserInputGrow(pxVar5,0xfa);
  }
  iVar8 = xmlSkipBlankChars(ctxt);
  if (iVar8 == 0) {
    msg = "Space required after \'ELEMENT\'\n";
    error = XML_ERR_SPACE_REQUIRED;
    goto LAB_001632a3;
  }
  pxVar9 = xmlParseName(ctxt);
  if (pxVar9 == (xmlChar *)0x0) {
    msg = "xmlParseElementDecl: no name for Element\n";
    error = XML_ERR_NAME_REQUIRED;
    goto LAB_001632a3;
  }
  iVar8 = xmlSkipBlankChars(ctxt);
  if (iVar8 == 0) {
    xmlFatalErrMsg(ctxt,XML_ERR_SPACE_REQUIRED,"Space required after the element name\n");
  }
  pxVar5 = ctxt->input;
  pbVar6 = pxVar5->cur;
  bVar1 = *pbVar6;
  if (bVar1 < 0x41) {
LAB_0016309b:
    if (bVar1 == 0x25) {
      if ((ctxt->external == 0) && (ctxt->inputNr == 1)) {
        msg = "PEReference: forbidden within markup decl in internal subset\n";
        error = XML_ERR_PEREF_IN_INT_SUBSET;
        goto LAB_001632a3;
      }
    }
    else if (bVar1 == 0x28) {
      iVar8 = xmlParseElementContentDecl(ctxt,pxVar9,&local_28);
LAB_001630bd:
      xmlSkipBlankChars(ctxt);
      if (ctxt->mlType == XML_TYPE_SML) {
        xVar2 = *ctxt->input->cur;
        if ((xVar2 == '\n') || (xVar2 == ';')) goto LAB_00163108;
LAB_001631f9:
        xmlFatalErr(ctxt,XML_ERR_GT_REQUIRED,(char *)0x0);
      }
      else {
        if ((ctxt->mlType != XML_TYPE_XML) || (*ctxt->input->cur != '>')) goto LAB_001631f9;
LAB_00163108:
        if (iVar4 != ctxt->input->id) {
          xmlFatalErrMsg(ctxt,XML_ERR_ENTITY_BOUNDARY,
                         "Element declaration doesn\'t start and stop in the same entity\n");
        }
        xmlNextChar(ctxt);
        cur = local_28;
        if (((ctxt->sax != (_xmlSAXHandler *)0x0) && (ctxt->disableSAX == 0)) &&
           (p_Var7 = ctxt->sax->elementDecl, p_Var7 != (elementDeclSAXFunc)0x0)) {
          if (local_28 == (xmlElementContentPtr)0x0) {
            (*p_Var7)(ctxt->userData,pxVar9,iVar8,(xmlElementContentPtr)0x0);
            return iVar8;
          }
          local_28->parent = (_xmlElementContent *)0x0;
          (*p_Var7)(ctxt->userData,pxVar9,iVar8,local_28);
          if (cur->parent != (_xmlElementContent *)0x0) {
            return iVar8;
          }
          doc = ctxt->myDoc;
          goto LAB_00163219;
        }
      }
      if (local_28 == (xmlElementContentPtr)0x0) {
        return iVar8;
      }
      doc = ctxt->myDoc;
      cur = local_28;
LAB_00163219:
      xmlFreeDocElementContent(doc,cur);
      return iVar8;
    }
  }
  else {
    if (bVar1 == 0x41) {
      if ((pbVar6[1] == 0x4e) && (pbVar6[2] == 0x59)) {
        pxVar5->cur = pbVar6 + 3;
        pxVar5->col = pxVar5->col + 3;
        iVar8 = 2;
        bVar1 = pbVar6[3];
        goto joined_r0x0016325f;
      }
      goto LAB_0016309b;
    }
    if ((((bVar1 == 0x45) && (pbVar6[1] == 0x4d)) && (pbVar6[2] == 0x50)) &&
       ((pbVar6[3] == 0x54 && (pbVar6[4] == 0x59)))) {
      pxVar5->cur = pbVar6 + 5;
      pxVar5->col = pxVar5->col + 5;
      iVar8 = 1;
      bVar1 = pbVar6[5];
joined_r0x0016325f:
      if (bVar1 == 0) {
        xmlParserInputGrow(pxVar5,0xfa);
      }
      goto LAB_001630bd;
    }
  }
  msg = "xmlParseElementDecl: \'EMPTY\', \'ANY\' or \'(\' expected\n";
  error = XML_ERR_ELEMCONTENT_NOT_STARTED;
LAB_001632a3:
  xmlFatalErrMsg(ctxt,error,msg);
  return -1;
}

Assistant:

int
xmlParseElementDecl(xmlParserCtxtPtr ctxt) {
    const xmlChar *name;
    int ret = -1;
    xmlElementContentPtr content  = NULL;

    DEBUG_ENTER(("xmlParseElementDecl(%s);\n", dbgCtxt(ctxt)));

    /* GROW; done in the caller */
    if (CMP9_MLI(CUR_PTR, '<', '!', 'E', 'L', 'E', 'M', 'E', 'N', 'T')) {
	int inputid = ctxt->input->id;

	SKIP_MLI(9);
	if (SKIP_BLANKS == 0) {
	    xmlFatalErrMsg(ctxt, XML_ERR_SPACE_REQUIRED,
		           "Space required after 'ELEMENT'\n");
	    RETURN_INT(-1);
	}
        name = xmlParseName(ctxt);
	if (name == NULL) {
	    xmlFatalErrMsg(ctxt, XML_ERR_NAME_REQUIRED,
			   "xmlParseElementDecl: no name for Element\n");
	    RETURN_INT(-1);
	}
	if (SKIP_BLANKS == 0) {
	    xmlFatalErrMsg(ctxt, XML_ERR_SPACE_REQUIRED,
			   "Space required after the element name\n");
	}
	if (CMP5(CUR_PTR, 'E', 'M', 'P', 'T', 'Y')) {
	    SKIP(5);
	    /*
	     * Element must always be empty.
	     */
	    ret = XML_ELEMENT_TYPE_EMPTY;
	} else if (CMP3(CUR_PTR, 'A', 'N', 'Y')) {
	    SKIP(3);
	    /*
	     * Element is a generic container.
	     */
	    ret = XML_ELEMENT_TYPE_ANY;
	} else if (RAW == '(') {
	    ret = xmlParseElementContentDecl(ctxt, name, &content);
	} else {
	    /*
	     * [ WFC: PEs in Internal Subset ] error handling.
	     */
	    if ((RAW == '%') && (ctxt->external == 0) &&
	        (ctxt->inputNr == 1)) {
		xmlFatalErrMsg(ctxt, XML_ERR_PEREF_IN_INT_SUBSET,
	  "PEReference: forbidden within markup decl in internal subset\n");
	    } else {
		xmlFatalErrMsg(ctxt, XML_ERR_ELEMCONTENT_NOT_STARTED,
		      "xmlParseElementDecl: 'EMPTY', 'ANY' or '(' expected\n");
            }
	    RETURN_INT(-1);
	}

	SKIP_BLANKS;

	if (!RAW_IS_GT_MLI) { /* (RAW != '>') */
	    xmlFatalErr(ctxt, XML_ERR_GT_REQUIRED, NULL);
	    if (content != NULL) {
		xmlFreeDocElementContent(ctxt->myDoc, content);
	    }
	} else {
	    if (inputid != ctxt->input->id) {
		xmlFatalErrMsg(ctxt, XML_ERR_ENTITY_BOUNDARY,
                               "Element declaration doesn't start and stop in"
                               " the same entity\n");
	    }

	    NEXT;
	    if ((ctxt->sax != NULL) && (!ctxt->disableSAX) &&
		(ctxt->sax->elementDecl != NULL)) {
		if (content != NULL)
		    content->parent = NULL;
	        ctxt->sax->elementDecl(ctxt->userData, name, ret,
		                       content);
		if ((content != NULL) && (content->parent == NULL)) {
		    /*
		     * this is a trick: if xmlAddElementDecl is called,
		     * instead of copying the full tree it is plugged directly
		     * if called from the parser. Avoid duplicating the
		     * interfaces or change the API/ABI
		     */
		    xmlFreeDocElementContent(ctxt->myDoc, content);
		}
	    } else if (content != NULL) {
		xmlFreeDocElementContent(ctxt->myDoc, content);
	    }
	}
    }
    RETURN_INT(ret);
}